

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall Fir1::Fir1(Fir1 *this,uint number_of_taps,double value)

{
  ulong uVar1;
  void *pvVar2;
  uint in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  uint i;
  uint local_1c;
  
  uVar1 = SUB168(ZEXT416(in_ESI) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_ESI) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar1);
  *in_RDI = (long)pvVar2;
  uVar1 = SUB168(ZEXT416(in_ESI) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_ESI) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar1);
  in_RDI[1] = (long)pvVar2;
  *(uint *)(in_RDI + 2) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = 0;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    *(undefined8 *)(*in_RDI + (ulong)local_1c * 8) = in_XMM0_Qa;
    *(undefined8 *)(in_RDI[1] + (ulong)local_1c * 8) = 0;
  }
  return;
}

Assistant:

Fir1::Fir1(unsigned number_of_taps, double value) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]),  
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
	        coefficients[i] = value;
		buffer[i] = 0;
	}
}